

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O2

string * __thiscall
arguments_t::operator[](string *__return_storage_ptr__,arguments_t *this,string *key)

{
  mapped_type *pmVar1;
  
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&this->options,key);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string arguments_t::operator[](std::string const & key) const {
    return this->options.at(key);
}